

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O2

void __thiscall
LineSplitter_SingleString_Test::LineSplitter_SingleString_Test(LineSplitter_SingleString_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001d62e8;
  return;
}

Assistant:

TEST (LineSplitter, SingleString) {
    using namespace pstore::dump;

    array::container container;
    auto const str = "hello\n"s;

    line_splitter ls (&container);
    ls.append (pstore::gsl::make_span (str));

    array arr (std::move (container));
    std::ostringstream out;
    arr.write (out);
    EXPECT_EQ (out.str (), "\n- hello");
}